

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O3

void LibXmlReporter__will_report_a_failing_test_only_once(void)

{
  uchar *actual;
  undefined8 uVar1;
  xmlNodePtr pxVar2;
  Constraint *pCVar3;
  Constraint_ *pCVar4;
  char *pcVar5;
  va_list null_arguments;
  __va_list_tag local_48;
  
  local_48.gp_offset = 0;
  local_48.fp_offset = 0;
  local_48.overflow_arg_area = (void *)0x0;
  local_48.reg_save_area = (void *)0x0;
  (*reporter->start_suite)(reporter,"suite_name",2);
  (*reporter->start_test)(reporter,"test_name");
  (*reporter->show_fail)(reporter,"file",2,"test_failure_message",&local_48);
  (*reporter->show_fail)(reporter,"file",2,"other_message",&local_48);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar5 = "filename";
  (*reporter->finish_suite)(reporter,"filename",0x29a);
  uVar1 = xmlParseDoc(output);
  uVar1 = xmlDocGetRootElement(uVar1);
  uVar1 = xmlFirstElementChild(uVar1);
  pxVar2 = (xmlNodePtr)xmlFirstElementChild(uVar1);
  pxVar2 = xmlnode_find_sibling(pxVar2,pcVar5);
  actual = pxVar2->name;
  pCVar3 = (Constraint *)create_equal_to_string_constraint("failure","FAILURE");
  cgreen::assert_that_<unsigned_char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
             ,0x132,"failure->name",actual,pCVar3);
  pCVar3 = create_xmlNode_has_attribute_equal_to
                     ("message",(xmlChar *)"test_failure_message","\"test_failure_message\"");
  pcVar5 = (char *)0x133;
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
             ,0x133,"failure",(long)pxVar2,pCVar3);
  pxVar2 = (xmlNodePtr)xmlNextElementSibling(pxVar2);
  pxVar2 = xmlnode_find_sibling(pxVar2,pcVar5);
  pCVar3 = create_xmlNode_has_attribute_equal_to
                     ("message",(xmlChar *)"other_message","\"other_message\"");
  pcVar5 = (char *)0x136;
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
             ,0x136,"failure",(long)pxVar2,pCVar3);
  pxVar2 = (xmlNodePtr)xmlNextElementSibling(pxVar2);
  pxVar2 = xmlnode_find_sibling(pxVar2,pcVar5);
  pCVar4 = (Constraint_ *)create_is_null_constraint();
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
             ,0x139,"failure",(long)pxVar2,pCVar4);
  return;
}

Assistant:

static void teardown_xml_reporter_tests(void) {
    //bad mojo when running tests in same process, as destroy_reporter also sets
    //context.reporter = NULL, thus breaking the next test to run
    destroy_reporter(reporter);
    if (NULL != output) {
        free(output);
        //need to set output to NULL to avoid second free in
        //subsequent call to setup_xml_reporter_tests->clear_output
        //when running tests in same process
        output = NULL;
    }
}